

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O2

S2Cap * __thiscall S2Cap::Union(S2Cap *__return_storage_ptr__,S2Cap *this,S2Cap *other)

{
  double dVar1;
  S1Angle SVar2;
  S1Angle SVar3;
  S2Cap *pSVar4;
  S2Point *x;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  VType VVar9;
  double dVar10;
  S1Angle local_40;
  S2Point local_38;
  
  dVar10 = (this->radius_).length2_;
  uVar5 = SUB84(dVar10,0);
  uVar6 = (undefined4)((ulong)dVar10 >> 0x20);
  do {
    pSVar4 = other;
    other = this;
    dVar1 = (double)CONCAT44(uVar6,uVar5);
    dVar10 = (pSVar4->radius_).length2_;
    uVar5 = SUB84(dVar10,0);
    uVar6 = (undefined4)((ulong)dVar10 >> 0x20);
    this = pSVar4;
  } while (dVar1 < dVar10);
  if (((dVar1 == 4.0) && (!NAN(dVar1))) || (dVar10 < 0.0)) {
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_00304750;
    uVar5 = *(undefined4 *)(other->center_).c_;
    uVar6 = *(undefined4 *)((long)(other->center_).c_ + 4);
    uVar7 = *(undefined4 *)((other->center_).c_ + 1);
    uVar8 = *(undefined4 *)((long)(other->center_).c_ + 0xc);
    VVar9 = (other->center_).c_[2];
    dVar10 = (other->radius_).length2_;
  }
  else {
    SVar2 = S1ChordAngle::ToAngle(&other->radius_);
    SVar3 = S1ChordAngle::ToAngle(&pSVar4->radius_);
    x = &other->center_;
    S1Angle::S1Angle(&local_40,x,&pSVar4->center_);
    if (SVar2.radians_ < SVar3.radians_ + local_40.radians_) {
      S2::InterpolateAtDistance
                (&local_38,(S1Angle)(((local_40.radians_ - SVar2.radians_) + SVar3.radians_) * 0.5),
                 x,&pSVar4->center_);
      S2Cap(__return_storage_ptr__,&local_38,
            (S1Angle)((SVar2.radians_ + local_40.radians_ + SVar3.radians_) * 0.5));
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_00304750;
    uVar5 = *(undefined4 *)x->c_;
    uVar6 = *(undefined4 *)((long)(other->center_).c_ + 4);
    uVar7 = *(undefined4 *)((other->center_).c_ + 1);
    uVar8 = *(undefined4 *)((long)(other->center_).c_ + 0xc);
    VVar9 = (other->center_).c_[2];
    dVar10 = (other->radius_).length2_;
  }
  *(undefined4 *)(__return_storage_ptr__->center_).c_ = uVar5;
  *(undefined4 *)((long)(__return_storage_ptr__->center_).c_ + 4) = uVar6;
  *(undefined4 *)((__return_storage_ptr__->center_).c_ + 1) = uVar7;
  *(undefined4 *)((long)(__return_storage_ptr__->center_).c_ + 0xc) = uVar8;
  (__return_storage_ptr__->center_).c_[2] = VVar9;
  (__return_storage_ptr__->radius_).length2_ = dVar10;
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2Cap::Union(const S2Cap& other) const {
  if (radius_ < other.radius_) {
    return other.Union(*this);
  }
  if (is_full() || other.is_empty()) {
    return *this;
  }
  // This calculation would be more efficient using S1ChordAngles.
  S1Angle this_radius = GetRadius();
  S1Angle other_radius = other.GetRadius();
  S1Angle distance(center(), other.center());
  if (this_radius >= distance + other_radius) {
    return *this;
  } else {
    S1Angle result_radius = 0.5 * (distance + this_radius + other_radius);
    S2Point result_center = S2::InterpolateAtDistance(
        0.5 * (distance - this_radius + other_radius),
        center(),
        other.center());
    return S2Cap(result_center, result_radius);
  }
}